

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

FileDescriptorProto * __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest::ParseFile
          (FileDescriptorProto *__return_storage_ptr__,ValidationErrorTest *this,
          string_view file_name,string_view file_text)

{
  bool bVar1;
  Nullable<const_char_*> failure_msg;
  LogMessage *pLVar2;
  Arena *arena;
  string_view v;
  LogMessage LStack_1d8;
  char *local_1c8;
  SimpleErrorCollector error_collector;
  Parser parser;
  ArrayInputStream input_stream;
  Tokenizer tokenizer;
  
  local_1c8 = file_text._M_str;
  io::ArrayInputStream::ArrayInputStream(&input_stream,local_1c8,(int)file_text._M_len,-1);
  error_collector.last_error_._M_dataplus._M_p = (pointer)&error_collector.last_error_.field_2;
  error_collector.super_ErrorCollector._vptr_ErrorCollector =
       (_func_int **)&PTR__SimpleErrorCollector_015fe658;
  error_collector.last_error_._M_string_length = 0;
  error_collector.last_error_.field_2._M_local_buf[0] = '\0';
  io::Tokenizer::Tokenizer
            (&tokenizer,&input_stream.super_ZeroCopyInputStream,
             &error_collector.super_ErrorCollector);
  compiler::Parser::Parser(&parser);
  parser.error_collector_ = &error_collector.super_ErrorCollector;
  FileDescriptorProto::FileDescriptorProto(__return_storage_ptr__);
  bVar1 = compiler::Parser::Parse(&parser,&tokenizer,__return_storage_ptr__);
  if (bVar1) {
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<char[1],std::__cxx11::string>
                            ((char (*) [1])(anon_var_dwarf_651463 + 5),&error_collector.last_error_,
                             "\"\" == error_collector.last_error()");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      *(byte *)&__return_storage_ptr__->field_0 = *(byte *)&__return_storage_ptr__->field_0 | 1;
      arena = (Arena *)(__return_storage_ptr__->super_Message).super_MessageLite._internal_metadata_
                       .ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set(&(__return_storage_ptr__->field_0)._impl_.name_,file_name,arena)
      ;
      compiler::Parser::~Parser(&parser);
      io::Tokenizer::~Tokenizer(&tokenizer);
      SimpleErrorCollector::~SimpleErrorCollector(&error_collector);
      return __return_storage_ptr__;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x11db,failure_msg);
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x11d8,"parser.Parse(&tokenizer, &proto)");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (&LStack_1d8,&error_collector.last_error_);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,(char (*) [2])0xebf4e6)
    ;
    v._M_str = local_1c8;
    v._M_len = file_text._M_len;
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,v);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
            ((LogMessageFatal *)&LStack_1d8);
}

Assistant:

FileDescriptorProto ParseFile(absl::string_view file_name,
                                absl::string_view file_text) {
    io::ArrayInputStream input_stream(file_text.data(), file_text.size());
    SimpleErrorCollector error_collector;
    io::Tokenizer tokenizer(&input_stream, &error_collector);
    compiler::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    FileDescriptorProto proto;
    ABSL_CHECK(parser.Parse(&tokenizer, &proto))
        << error_collector.last_error() << "\n"
        << file_text;
    ABSL_CHECK_EQ("", error_collector.last_error());
    proto.set_name(file_name);
    return proto;
  }